

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiIO::AddInputCharacter(ImGuiIO *this,uint c)

{
  int *piVar1;
  int iVar2;
  ImGuiInputEvent *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiInputEvent *__dest;
  int iVar5;
  int iVar6;
  ImGuiContext *ctx;
  
  pIVar4 = GImGui;
  if ((c != 0) && (this->AppAcceptingEvents == true)) {
    iVar6 = (GImGui->InputEventsQueue).Size;
    iVar2 = (GImGui->InputEventsQueue).Capacity;
    if (iVar6 == iVar2) {
      iVar6 = iVar6 + 1;
      if (iVar2 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar2 / 2 + iVar2;
      }
      if (iVar6 < iVar5) {
        iVar6 = iVar5;
      }
      if (iVar2 < iVar6) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiInputEvent *)
                 (*GImAllocatorAllocFunc)((long)iVar6 * 0x18,GImAllocatorUserData);
        pIVar3 = (pIVar4->InputEventsQueue).Data;
        if (pIVar3 != (ImGuiInputEvent *)0x0) {
          memcpy(__dest,pIVar3,(long)(pIVar4->InputEventsQueue).Size * 0x18);
          pIVar3 = (pIVar4->InputEventsQueue).Data;
          if ((pIVar3 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
        }
        (pIVar4->InputEventsQueue).Data = __dest;
        (pIVar4->InputEventsQueue).Capacity = iVar6;
      }
    }
    pIVar3 = (pIVar4->InputEventsQueue).Data;
    iVar6 = (pIVar4->InputEventsQueue).Size;
    pIVar3[iVar6].Type = ImGuiInputEventType_Text;
    pIVar3[iVar6].Source = ImGuiInputSource_Keyboard;
    pIVar3[iVar6].field_2.Key.Key = c;
    *(undefined8 *)((long)&pIVar3[iVar6].field_2 + 4) = 0;
    *(undefined4 *)&pIVar3[iVar6].AddedByTestEngine = 0;
    (pIVar4->InputEventsQueue).Size = (pIVar4->InputEventsQueue).Size + 1;
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharacter(unsigned int c)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    if (c == 0 || !AppAcceptingEvents)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Text;
    e.Source = ImGuiInputSource_Keyboard;
    e.Text.Char = c;
    g.InputEventsQueue.push_back(e);
}